

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O1

int cfg_db_remove_namedsection(cfg_db *db,char *section_type,char *section_name)

{
  int iVar1;
  avl_node *paVar2;
  cfg_named_section *named;
  
  paVar2 = avl_find(&db->sectiontypes,section_type);
  if (paVar2 == (avl_node *)0x0) {
    named = (cfg_named_section *)0x0;
  }
  else {
    named = (cfg_named_section *)avl_find((avl_tree *)&paVar2[1].parent,section_name);
  }
  if (named == (cfg_named_section *)0x0) {
    iVar1 = -1;
  }
  else {
    _free_namedsection(named);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_db_remove_namedsection(struct cfg_db *db, const char *section_type, const char *section_name) {
  struct cfg_named_section *named;

  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named == NULL) {
    return -1;
  }

  /* only free named section */
  _free_namedsection(named);
  return 0;
}